

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O3

void ClipperLib::OffsetPolygons
               (Polygons *in_polys,Polygons *out_polys,double delta,JoinType jointype,
               double MiterLimit)

{
  PolyOffsetBuilder *this;
  Polygons poly2;
  undefined1 local_110 [24];
  PolyOffsetBuilder local_f8;
  PolyOffsetBuilder local_88;
  
  if (out_polys == in_polys) {
    std::
    vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
    ::vector((vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
              *)local_110,in_polys);
    PolyOffsetBuilder::PolyOffsetBuilder
              ((PolyOffsetBuilder *)(local_110 + 0x18),
               (vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
                *)local_110,out_polys,delta,jointype,MiterLimit);
    if (local_f8.normals.
        super__Vector_base<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_f8.normals.
                      super__Vector_base<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_f8.normals.
                            super__Vector_base<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_f8.normals.
                            super__Vector_base<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    std::
    vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
    ::~vector((vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
               *)(local_110 + 0x18));
    this = (PolyOffsetBuilder *)local_110;
  }
  else {
    PolyOffsetBuilder::PolyOffsetBuilder(&local_88,in_polys,out_polys,delta,jointype,MiterLimit);
    if (local_88.normals.
        super__Vector_base<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_88.normals.
                      super__Vector_base<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_88.normals.
                            super__Vector_base<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_88.normals.
                            super__Vector_base<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    this = &local_88;
  }
  std::
  vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
  ::~vector(&this->m_p);
  return;
}

Assistant:

void OffsetPolygons(const Polygons &in_polys, Polygons &out_polys,
  double delta, JoinType jointype, double MiterLimit)
{
  if (&out_polys == &in_polys)
  {
    Polygons poly2(in_polys);
    PolyOffsetBuilder(poly2, out_polys, delta, jointype, MiterLimit);
  }
  else PolyOffsetBuilder(in_polys, out_polys, delta, jointype, MiterLimit);
}